

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O0

void anon_unknown.dwarf_29e1c9::CollectMeshes
               (aiNode *node,
               multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
               *meshes)

{
  multimap<aiNode_const*,unsigned_int,std::less<aiNode_const*>,std::allocator<std::pair<aiNode_const*const,unsigned_int>>>
  *this;
  pair<const_aiNode_*,_unsigned_int> pVar1;
  uint local_4c;
  uint i_1;
  pair<const_aiNode_*,_unsigned_int> local_30;
  uint local_1c;
  multimap<aiNode_const*,unsigned_int,std::less<aiNode_const*>,std::allocator<std::pair<aiNode_const*const,unsigned_int>>>
  *pmStack_18;
  uint i;
  multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
  *meshes_local;
  aiNode *node_local;
  
  pmStack_18 = (multimap<aiNode_const*,unsigned_int,std::less<aiNode_const*>,std::allocator<std::pair<aiNode_const*const,unsigned_int>>>
                *)meshes;
  meshes_local = (multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
                  *)node;
  for (local_1c = 0; this = pmStack_18,
      local_1c < *(uint *)&meshes_local[0x17]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ; local_1c = local_1c + 1) {
    pVar1 = std::make_pair<aiNode_const*&,unsigned_int&>
                      ((aiNode **)&meshes_local,
                       &(meshes_local[0x17]._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                        _M_color + local_1c);
    local_30.first = pVar1.first;
    local_30.second = pVar1.second;
    std::
    multimap<aiNode_const*,unsigned_int,std::less<aiNode_const*>,std::allocator<std::pair<aiNode_const*const,unsigned_int>>>
    ::insert<std::pair<aiNode_const*,unsigned_int>>(this,&local_30);
  }
  for (local_4c = 0; local_4c < *(uint *)&meshes_local[0x17]._M_t._M_impl; local_4c = local_4c + 1)
  {
    CollectMeshes(*(aiNode **)
                   (*(long *)&meshes_local[0x17]._M_t._M_impl.super__Rb_tree_header._M_header +
                   (ulong)local_4c * 8),
                  (multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
                   *)pmStack_18);
  }
  return;
}

Assistant:

void CollectMeshes(const aiNode* node, std::multimap<const aiNode*, unsigned int>& meshes) {
        for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
            meshes.insert(std::make_pair(node, node->mMeshes[i]));
        }
        for (unsigned int i = 0; i < node->mNumChildren; ++i) {
            CollectMeshes(node->mChildren[i], meshes);
        }
    }